

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::UncoreMinimize::Todo::shrinkNext(Todo *this,UncoreMinimize *self,ValueRep result)

{
  uint uVar1;
  uint32 uVar2;
  char in_DL;
  long in_RSI;
  long in_RDI;
  uint32 s;
  uint32 mx;
  uint32 t;
  bool local_39;
  uint local_28;
  bool local_1;
  
  if ((*(uint *)(in_RSI + 0x104) >> 5 & 7) == 6) {
    local_1 = subsetNext((Todo *)self,(UncoreMinimize *)CONCAT17(result,_t),mx._3_1_);
  }
  else {
    if (in_DL == '\x02') {
      *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x14);
      *(undefined4 *)(in_RDI + 0x1c) = 0;
    }
    else {
      *(undefined4 *)(in_RDI + 0x14) = *(undefined4 *)(in_RDI + 0x18);
    }
    uVar1 = *(uint *)(in_RSI + 0x104) >> 5 & 7;
    uVar2 = size((Todo *)0x1b4b9b);
    local_28 = *(uint *)(in_RDI + 0x1c);
    switch(uVar1) {
    default:
      local_28 = 1;
      *(undefined4 *)(in_RDI + 0x1c) = 1;
      break;
    case 2:
      local_28 = (uVar2 - *(int *)(in_RDI + 0x18)) - 1;
      *(uint *)(in_RDI + 0x1c) = local_28;
      break;
    case 3:
      local_28 = uVar2 - *(int *)(in_RDI + 0x18) >> 1;
      *(uint *)(in_RDI + 0x1c) = local_28;
      break;
    case 4:
    case 5:
      if (local_28 == 0) {
        local_28 = (uint)(*(int *)(in_RDI + 0x14) == 0);
        *(uint *)(in_RDI + 0x1c) = local_28;
      }
      else if (*(int *)(in_RDI + 0x18) + local_28 < uVar2) {
        *(uint *)(in_RDI + 0x1c) = local_28 << 1;
      }
      else if (uVar1 == 4) {
        *(undefined4 *)(in_RDI + 0x1c) = 2;
        local_28 = 1;
      }
      else {
        local_28 = uVar2 - *(int *)(in_RDI + 0x18) >> 1;
      }
    }
    local_39 = false;
    if (local_28 != 0) {
      local_28 = local_28 + *(int *)(in_RDI + 0x18);
      *(uint *)(in_RDI + 0x18) = local_28;
      local_39 = local_28 < uVar2;
    }
    local_1 = local_39;
  }
  return local_1;
}

Assistant:

bool UncoreMinimize::Todo::shrinkNext(UncoreMinimize& self, ValueRep result) {
	if (self.options_.trim == OptParams::usc_trim_min) {
		return subsetNext(self, result);
	}
	if (result == value_false) {
		next_ = last_;
		step_ = 0u;
	}
	else {
		last_ = next_;
	}
	const uint32 t  = self.options_.trim;
	const uint32 mx = size();
	uint32 s = step_;
	switch (t) {
		default:
		case OptParams::usc_trim_lin: step_ = s = 1;                break;
		case OptParams::usc_trim_inv: step_ = s = (mx - next_) - 1; break;
		case OptParams::usc_trim_bin: step_ = s = (mx - next_) / 2; break;
		case OptParams::usc_trim_rgs: // fallthrough
		case OptParams::usc_trim_exp:
			if      (s == 0u)                      { step_ = s = uint32(last_ == 0u); }
			else if ((next_ + s) < mx)             { step_ = s * 2; }
			else if (t == OptParams::usc_trim_rgs) { step_ = 2; s = 1; }
			else                                   { s = (mx - next_) / 2; }
			break;
	}
	return s && (next_ += s) < mx;
}